

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipv4_address.c
# Opt level: O1

LY_ERR lyplg_type_dup_ipv4_address(ly_ctx *ctx,lyd_value *original,lyd_value *dup)

{
  LY_ERR LVar1;
  
  (dup->field_2).dec64 = 0;
  *(undefined8 *)((long)&dup->field_2 + 8) = 0;
  dup->_canonical = (char *)0x0;
  dup->realtype = (lysc_type *)0x0;
  *(undefined8 *)((long)&dup->field_2 + 0x10) = 0;
  LVar1 = lydict_insert(ctx,original->_canonical,0,&dup->_canonical);
  if (LVar1 == LY_SUCCESS) {
    (dup->field_2).dec64 = 0;
    *(undefined8 *)((long)&dup->field_2 + 8) = 0;
    (dup->field_2).int32 = (original->field_2).int32;
    LVar1 = lydict_insert(ctx,*(char **)((long)&original->field_2 + 8),0,
                          (char **)((long)&dup->field_2 + 8));
    if (LVar1 == LY_SUCCESS) {
      dup->realtype = original->realtype;
      return LY_SUCCESS;
    }
  }
  lydict_remove(ctx,dup->_canonical);
  dup->_canonical = (char *)0x0;
  lydict_remove(ctx,*(char **)((long)&dup->field_2 + 8));
  return LVar1;
}

Assistant:

static LY_ERR
lyplg_type_dup_ipv4_address(const struct ly_ctx *ctx, const struct lyd_value *original, struct lyd_value *dup)
{
    LY_ERR ret;
    struct lyd_value_ipv4_address *orig_val, *dup_val;

    memset(dup, 0, sizeof *dup);

    ret = lydict_insert(ctx, original->_canonical, 0, &dup->_canonical);
    LY_CHECK_GOTO(ret, error);

    LYPLG_TYPE_VAL_INLINE_PREPARE(dup, dup_val);
    LY_CHECK_ERR_GOTO(!dup_val, ret = LY_EMEM, error);

    LYD_VALUE_GET(original, orig_val);

    memcpy(&dup_val->addr, &orig_val->addr, sizeof orig_val->addr);
    ret = lydict_insert(ctx, orig_val->zone, 0, &dup_val->zone);
    LY_CHECK_GOTO(ret, error);

    dup->realtype = original->realtype;
    return LY_SUCCESS;

error:
    lyplg_type_free_ipv4_address(ctx, dup);
    return ret;
}